

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos bcemit_branch(FuncState *fs,ExpDesc *e,int cond)

{
  BCInsLine *pBVar1;
  uint uVar2;
  BCIns *ip;
  BCPos pc;
  int cond_local;
  ExpDesc *e_local;
  FuncState *fs_local;
  
  if ((e->k == VRELOCABLE) && (pBVar1 = fs->bcbase + (e->u).s.info, (pBVar1->ins & 0xff) == 0x13)) {
    uVar2 = 0xe;
    if (cond != 0) {
      uVar2 = 0xf;
    }
    pBVar1->ins = uVar2 | pBVar1->ins & 0xffff0000;
    fs_local._4_4_ = bcemit_jmp(fs);
  }
  else {
    if (e->k != VNONRELOC) {
      bcreg_reserve(fs,1);
      expr_toreg_nobranch(fs,e,fs->freereg - 1);
    }
    uVar2 = 0xd;
    if (cond != 0) {
      uVar2 = 0xc;
    }
    bcemit_INS(fs,uVar2 | 0xff00 | (e->u).s.info << 0x10);
    fs_local._4_4_ = bcemit_jmp(fs);
    expr_free(fs,e);
  }
  return fs_local._4_4_;
}

Assistant:

static BCPos bcemit_branch(FuncState *fs, ExpDesc *e, int cond)
{
  BCPos pc;
  if (e->k == VRELOCABLE) {
    BCIns *ip = bcptr(fs, e);
    if (bc_op(*ip) == BC_NOT) {
      *ip = BCINS_AD(cond ? BC_ISF : BC_IST, 0, bc_d(*ip));
      return bcemit_jmp(fs);
    }
  }
  if (e->k != VNONRELOC) {
    bcreg_reserve(fs, 1);
    expr_toreg_nobranch(fs, e, fs->freereg-1);
  }
  bcemit_AD(fs, cond ? BC_ISTC : BC_ISFC, NO_REG, e->u.s.info);
  pc = bcemit_jmp(fs);
  expr_free(fs, e);
  return pc;
}